

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void process_replacement(c2m_ctx_t c2m_ctx,macro_call_t mc)

{
  macro_t pmVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  token_t *pptVar5;
  size_t sVar6;
  token_t ptVar7;
  VARR_token_t *tokens;
  token_arr_t tokens_00;
  int local_44;
  int copy_p;
  int sharp_pos;
  int m_repl_len;
  int i;
  VARR_token_t *arg;
  token_t *m_repl;
  token_t t;
  macro_t m;
  macro_call_t mc_local;
  c2m_ctx_t c2m_ctx_local;
  
  pmVar1 = mc->macro;
  local_44 = -1;
  pptVar5 = VARR_token_taddr(pmVar1->replacement);
  sVar6 = VARR_token_tlength(pmVar1->replacement);
  iVar3 = (int)sVar6;
  do {
    while( true ) {
      if (iVar3 <= mc->repl_pos) {
        ptVar7 = get_next_pptoken(c2m_ctx);
        unget_next_pptoken(c2m_ctx,ptVar7);
        ptVar7 = new_token(c2m_ctx,ptVar7->pos,"",0x145,N_IGNORE);
        unget_next_pptoken(c2m_ctx,ptVar7);
        tokens = do_concat(c2m_ctx,mc->repl_buffer);
        push_back(c2m_ctx,tokens);
        pmVar1->ignore_p = 1;
        return;
      }
      iVar4 = mc->repl_pos;
      mc->repl_pos = iVar4 + 1;
      m_repl = (token_t *)pptVar5[iVar4];
      bVar2 = true;
      if ((short)*(undefined4 *)m_repl != 0x103) break;
      iVar4 = find_param(pmVar1->params,((token_t)m_repl)->repr);
      if (iVar4 < 0) goto LAB_0019bd59;
      tokens_00 = VARR_token_arr_tget(mc->args,(long)iVar4);
      if (-1 < local_44) {
        del_tokens(mc->repl_buffer,local_44,-1);
        sVar6 = VARR_token_tlength(tokens_00);
        if ((sVar6 != 0) &&
           ((ptVar7 = VARR_token_tget(tokens_00,0), (short)*(undefined4 *)ptVar7 == 0x20 ||
            (ptVar7 = VARR_token_tget(tokens_00,0), (short)*(undefined4 *)ptVar7 == 10)))) {
          del_tokens(tokens_00,0,1);
        }
        sVar6 = VARR_token_tlength(tokens_00);
        if ((sVar6 != 0) &&
           ((ptVar7 = VARR_token_tlast(tokens_00), (short)*(undefined4 *)ptVar7 == 0x20 ||
            (ptVar7 = VARR_token_tlast(tokens_00), (short)*(undefined4 *)ptVar7 == 10)))) {
          VARR_token_tpop(tokens_00);
        }
        m_repl = (token_t *)token_stringify(c2m_ctx,mc->macro->id,tokens_00);
LAB_0019bd16:
        bVar2 = false;
        goto LAB_0019bd59;
      }
      if (((((mc->repl_pos < 2) || ((short)*(undefined4 *)pptVar5[mc->repl_pos + -2] != 0x142)) &&
           ((mc->repl_pos < 3 ||
            (((short)*(undefined4 *)pptVar5[mc->repl_pos + -2] != 0x20 ||
             ((short)*(undefined4 *)pptVar5[mc->repl_pos + -3] != 0x142)))))) &&
          ((iVar3 <= mc->repl_pos || ((short)*(undefined4 *)pptVar5[mc->repl_pos] != 0x142)))) &&
         (((iVar3 <= mc->repl_pos + 1 || ((short)*(undefined4 *)pptVar5[mc->repl_pos + 1] != 0x142))
          || ((short)*(undefined4 *)pptVar5[mc->repl_pos] != 0x20)))) {
        ptVar7 = new_token(c2m_ctx,((token_t)m_repl)->pos,"",0x144,N_IGNORE);
        unget_next_pptoken(c2m_ctx,ptVar7);
        copy_and_push_back(c2m_ctx,tokens_00,mc->pos);
        ptVar7 = new_token(c2m_ctx,((token_t)m_repl)->pos,"",0x143,N_IGNORE);
        unget_next_pptoken(c2m_ctx,ptVar7);
        return;
      }
      sVar6 = VARR_token_tlength(tokens_00);
      if ((sVar6 == 0) ||
         ((sVar6 = VARR_token_tlength(tokens_00), sVar6 == 1 &&
          ((ptVar7 = VARR_token_tget(tokens_00,0), (short)*(undefined4 *)ptVar7 == 0x20 ||
           (ptVar7 = VARR_token_tget(tokens_00,0), (short)*(undefined4 *)ptVar7 == 10)))))) {
        m_repl = (token_t *)new_token(c2m_ctx,((token_t)m_repl)->pos,"",0x141,N_IGNORE);
        goto LAB_0019bd16;
      }
      add_tokens(mc->repl_buffer,tokens_00);
    }
    if ((short)*(undefined4 *)m_repl == 0x23) {
      sVar6 = VARR_token_tlength(mc->repl_buffer);
      local_44 = (int)sVar6;
    }
    else if ((short)*(undefined4 *)m_repl != 0x20) {
      local_44 = -1;
    }
LAB_0019bd59:
    if (bVar2) {
      m_repl = (token_t *)copy_token(c2m_ctx,(token_t)m_repl,mc->pos);
    }
    add_token(mc->repl_buffer,(token_t)m_repl);
  } while( true );
}

Assistant:

static void process_replacement (c2m_ctx_t c2m_ctx, macro_call_t mc) {
  macro_t m;
  token_t t, *m_repl;
  VARR (token_t) * arg;
  int i, m_repl_len, sharp_pos, copy_p;

  m = mc->macro;
  sharp_pos = -1;
  m_repl = VARR_ADDR (token_t, m->replacement);
  m_repl_len = (int) VARR_LENGTH (token_t, m->replacement);
  for (;;) {
    if (mc->repl_pos >= m_repl_len) {
      t = get_next_pptoken (c2m_ctx);
      unget_next_pptoken (c2m_ctx, t);
#ifdef C2MIR_PREPRO_DEBUG
      fprintf (stderr, "# push back <%s>\n", get_token_str (t));
#endif
      unget_next_pptoken (c2m_ctx, new_token (c2m_ctx, t->pos, "", T_EOR, N_IGNORE));
#ifdef C2MIR_PREPRO_DEBUG
      fprintf (stderr, "# push back <EOR>: mc=%lx\n", mc);
#endif
      push_back (c2m_ctx, do_concat (c2m_ctx, mc->repl_buffer));
      m->ignore_p = TRUE;
      return;
    }
    t = m_repl[mc->repl_pos++];
    copy_p = TRUE;
    if (t->code == T_ID) {
      i = find_param (m->params, t->repr);
      if (i >= 0) {
        arg = VARR_GET (token_arr_t, mc->args, i);
        if (sharp_pos >= 0) {
          del_tokens (mc->repl_buffer, sharp_pos, -1);
          if (VARR_LENGTH (token_t, arg) != 0
              && (VARR_GET (token_t, arg, 0)->code == ' '
                  || VARR_GET (token_t, arg, 0)->code == '\n'))
            del_tokens (arg, 0, 1);
          if (VARR_LENGTH (token_t, arg) != 0
              && (VARR_LAST (token_t, arg)->code == ' ' || VARR_LAST (token_t, arg)->code == '\n'))
            VARR_POP (token_t, arg);
          t = token_stringify (c2m_ctx, mc->macro->id, arg);
          copy_p = FALSE;
        } else if ((mc->repl_pos >= 2 && m_repl[mc->repl_pos - 2]->code == T_RDBLNO)
                   || (mc->repl_pos >= 3 && m_repl[mc->repl_pos - 2]->code == ' '
                       && m_repl[mc->repl_pos - 3]->code == T_RDBLNO)
                   || (mc->repl_pos < m_repl_len && m_repl[mc->repl_pos]->code == T_RDBLNO)
                   || (mc->repl_pos + 1 < m_repl_len && m_repl[mc->repl_pos + 1]->code == T_RDBLNO
                       && m_repl[mc->repl_pos]->code == ' ')) {
          if (VARR_LENGTH (token_t, arg) == 0
              || (VARR_LENGTH (token_t, arg) == 1
                  && (VARR_GET (token_t, arg, 0)->code == ' '
                      || VARR_GET (token_t, arg, 0)->code == '\n'))) {
            t = new_token (c2m_ctx, t->pos, "", T_PLM, N_IGNORE);
            copy_p = FALSE;
          } else {
            add_tokens (mc->repl_buffer, arg);
            continue;
          }
        } else {
          unget_next_pptoken (c2m_ctx, new_token (c2m_ctx, t->pos, "", T_EOA, N_IGNORE));
#ifdef C2MIR_PREPRO_DEBUG
          fprintf (stderr, "# push back <EOA> for macro %s call\n", mc->macro->id->repr);
#endif
          copy_and_push_back (c2m_ctx, arg, mc->pos);
          unget_next_pptoken (c2m_ctx, new_token (c2m_ctx, t->pos, "", T_BOA, N_IGNORE));
#ifdef C2MIR_PREPRO_DEBUG
          fprintf (stderr, "# push back <BOA> for macro %s call\n", mc->macro->id->repr);
#endif
          return;
        }
      }
    } else if (t->code == '#') {
      sharp_pos = (int) VARR_LENGTH (token_t, mc->repl_buffer);
    } else if (t->code != ' ') {
      sharp_pos = -1;
    }
    if (copy_p) t = copy_token (c2m_ctx, t, mc->pos);
    add_token (mc->repl_buffer, t);
  }
}